

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O1

STBase * __thiscall jbcoin::STObject::makeFieldPresent(STObject *this,SField *field)

{
  STBase *pSVar1;
  int iVar2;
  int iVar3;
  _func_int **pp_Var4;
  pointer pSVar5;
  STVar SStack_78;
  
  iVar2 = getFieldIndex(this,field);
  if (iVar2 == -1) {
    if (this->mType != (SOTemplate *)0x0) {
      Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
    }
    std::vector<jbcoin::detail::STVar,std::allocator<jbcoin::detail::STVar>>::
    emplace_back<jbcoin::detail::nonPresentObject_t&,jbcoin::SField_const&>
              ((vector<jbcoin::detail::STVar,std::allocator<jbcoin::detail::STVar>> *)&this->v_,
               (nonPresentObject_t *)&detail::nonPresentObject,field);
    pSVar5 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar5 = pSVar5 + ((int)((ulong)((long)(this->v_).
                                           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5
                                    ) >> 5) * -0x55555555 + -1);
    goto LAB_001b620b;
  }
  pSVar1 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start[iVar2].p_;
  iVar3 = (*pSVar1->_vptr_STBase[4])(pSVar1);
  if (iVar3 != 0) {
    return pSVar1;
  }
  detail::STVar::STVar(&SStack_78,pSVar1->fName->fieldType,pSVar1->fName);
  detail::STVar::operator=
            ((this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start + iVar2,&SStack_78);
  if ((STVar *)SStack_78.p_ == &SStack_78) {
    pp_Var4 = (SStack_78.p_)->_vptr_STBase;
LAB_001b61fe:
    (**pp_Var4)();
  }
  else if (SStack_78.p_ != (STBase *)0x0) {
    pp_Var4 = (SStack_78.p_)->_vptr_STBase + 1;
    goto LAB_001b61fe;
  }
  pSVar5 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start + iVar2;
LAB_001b620b:
  return pSVar5->p_;
}

Assistant:

STBase* STObject::makeFieldPresent (SField const& field)
{
    int index = getFieldIndex (field);

    if (index == -1)
    {
        if (!isFree ())
            Throw<std::runtime_error> ("Field not found");

        return getPIndex (emplace_back(detail::nonPresentObject, field));
    }

    STBase* f = getPIndex (index);

    if (f->getSType () != STI_NOTPRESENT)
        return f;

    v_[index] = detail::STVar(
        detail::defaultObject, f->getFName());
    return getPIndex (index);
}